

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O0

void __thiscall gl4cts::BufferStorage::Shader::Init(Shader *this,GLenum stage,string *source)

{
  byte bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  Functions *gl;
  string *source_local;
  GLenum stage_local;
  Shader *this_local;
  Functions *gl_00;
  
  bVar1 = std::__cxx11::string::empty();
  if ((bVar1 & 1) != 1) {
    Release(this);
    pRVar3 = deqp::Context::getRenderContext(this->m_context);
    iVar2 = (*pRVar3->_vptr_RenderContext[3])();
    gl_00 = (Functions *)CONCAT44(extraout_var,iVar2);
    Create(gl_00,stage,&this->m_id);
    Source(gl_00,this->m_id,source);
    Compile(gl_00,this->m_id);
  }
  return;
}

Assistant:

void Shader::Init(glw::GLenum stage, const std::string& source)
{
	if (true == source.empty())
	{
		/* No source == no shader */
		return;
	}

	/* Delete any previous shader */
	Release();

	/* Create, set source and compile */
	const Functions& gl = m_context.getRenderContext().getFunctions();

	Create(gl, stage, m_id);
	Source(gl, m_id, source);

	Compile(gl, m_id);
}